

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ConstRepeatedFieldIterator_Traits_Test::
ConstRepeatedFieldIterator_Traits_Test(ConstRepeatedFieldIterator_Traits_Test *this)

{
  ConstRepeatedFieldIterator_Traits_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ConstRepeatedFieldIterator_Traits_Test_029e6ce8;
  return;
}

Assistant:

TEST(ConstRepeatedFieldIterator, Traits) {
  using It = RepeatedField<absl::Cord>::const_iterator;
  EXPECT_TRUE((std::is_same<It::value_type, absl::Cord>::value));
  EXPECT_TRUE((std::is_same<It::reference, const absl::Cord&>::value));
  EXPECT_TRUE((std::is_same<It::pointer, const absl::Cord*>::value));
  EXPECT_TRUE((std::is_same<It::difference_type, std::ptrdiff_t>::value));
  EXPECT_TRUE((std::is_same<It::iterator_category,
                            std::random_access_iterator_tag>::value));
#if __cplusplus >= 202002L
  EXPECT_TRUE((
      std::is_same<It::iterator_concept, std::contiguous_iterator_tag>::value));
#else
  EXPECT_TRUE((std::is_same<It::iterator_concept,
                            std::random_access_iterator_tag>::value));
#endif
}